

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

tuple __thiscall
pybind11::make_tuple<(pybind11::return_value_policy)1,ki::protocol::dml::Message_const*&>
          (pybind11 *this,Message **args_)

{
  array<pybind11::object,_1UL> aVar1;
  cast_error *this_00;
  array<pybind11::object,_1UL> args;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_1UL>
  argtypes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  args._M_elems[0].super_handle.m_ptr =
       (_Type)detail::type_caster_base<ki::protocol::dml::Message>::cast
                        (*args_,automatic_reference,(handle)0x0);
  if (args._M_elems[0].super_handle.m_ptr == (object)0x0) {
    std::__cxx11::string::string
              ((string *)&argtypes,"PKN2ki8protocol3dml7MessageE",(allocator *)&local_58);
    detail::clean_type_id(argtypes._M_elems);
    this_00 = (cast_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_38,"make_tuple(): unable to convert argument of type \'",argtypes._M_elems
                  );
    std::operator+(&local_58,&local_38,"\' to Python object");
    cast_error::runtime_error(this_00,&local_58);
    __cxa_throw(this_00,&cast_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tuple::tuple((tuple *)this,1);
  aVar1._M_elems[0].super_handle.m_ptr = args._M_elems[0].super_handle.m_ptr;
  args._M_elems[0].super_handle.m_ptr = (_Type)(object)0x0;
  if ((*(byte *)(*(long *)(*(long *)this + 8) + 0xab) & 4) != 0) {
    (*(_Type *)(*(long *)this + 0x18))[0] = (object)aVar1._M_elems[0].super_handle.m_ptr;
    object::~object(args._M_elems);
    return (object)(object)this;
  }
  __assert_fail("PyTuple_Check(result.ptr())",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Joshsora[P]kipy/dependencies/pybind11/include/pybind11/cast.h"
                ,0x6e2,
                "tuple pybind11::make_tuple(Args &&...) [policy = pybind11::return_value_policy::automatic_reference, Args = <const ki::protocol::dml::Message *&>]"
               );
}

Assistant:

tuple make_tuple(Args&&... args_) {
    constexpr size_t size = sizeof...(Args);
    std::array<object, size> args {
        { reinterpret_steal<object>(detail::make_caster<Args>::cast(
            std::forward<Args>(args_), policy, nullptr))... }
    };
    for (size_t i = 0; i < args.size(); i++) {
        if (!args[i]) {
#if defined(NDEBUG)
            throw cast_error("make_tuple(): unable to convert arguments to Python object (compile in debug mode for details)");
#else
            std::array<std::string, size> argtypes { {type_id<Args>()...} };
            throw cast_error("make_tuple(): unable to convert argument of type '" +
                argtypes[i] + "' to Python object");
#endif
        }
    }
    tuple result(size);
    int counter = 0;
    for (auto &arg_value : args)
        PyTuple_SET_ITEM(result.ptr(), counter++, arg_value.release().ptr());
    return result;
}